

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall google::protobuf::FileOptions::MergeFrom(FileOptions *this,Message *from)

{
  LogMessage *other;
  LogMessage local_60;
  LogFinisher local_21;
  
  if ((FileOptions *)from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/descriptor.pb.cc"
               ,0x1b89);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_21,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  if ((from->super_MessageLite)._vptr_MessageLite == (_func_int **)&PTR__FileOptions_003b9af8) {
    MergeFrom(this,(FileOptions *)from);
  }
  else {
    internal::ReflectionOps::Merge(from,&this->super_Message);
  }
  return;
}

Assistant:

void FileOptions::MergeFrom(const ::PROTOBUF_NAMESPACE_ID::Message& from) {
// @@protoc_insertion_point(generalized_merge_from_start:google.protobuf.FileOptions)
  GOOGLE_DCHECK_NE(&from, this);
  const FileOptions* source =
      ::PROTOBUF_NAMESPACE_ID::DynamicCastToGenerated<FileOptions>(
          &from);
  if (source == nullptr) {
  // @@protoc_insertion_point(generalized_merge_from_cast_fail:google.protobuf.FileOptions)
    ::PROTOBUF_NAMESPACE_ID::internal::ReflectionOps::Merge(from, this);
  } else {
  // @@protoc_insertion_point(generalized_merge_from_cast_success:google.protobuf.FileOptions)
    MergeFrom(*source);
  }
}